

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  int iVar1;
  ulong in_RAX;
  uint c;
  undefined8 uStack_28;
  
  if (this->AppAcceptingEvents == true) {
    uStack_28 = in_RAX;
    for (; *utf8_chars != '\0'; utf8_chars = utf8_chars + iVar1) {
      uStack_28 = uStack_28 & 0xffffffff;
      iVar1 = ImTextCharFromUtf8((uint *)((long)&uStack_28 + 4),utf8_chars,(char *)0x0);
      if (uStack_28._4_4_ != 0) {
        AddInputCharacter(this,uStack_28._4_4_);
      }
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    if (!AppAcceptingEvents)
        return;
    while (*utf8_chars != 0)
    {
        unsigned int c = 0;
        utf8_chars += ImTextCharFromUtf8(&c, utf8_chars, NULL);
        if (c != 0)
            AddInputCharacter(c);
    }
}